

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::Cleanup(FunctionBody *this,bool isScriptContextClosing)

{
  code *pcVar1;
  bool bVar2;
  ByteBlock **ppBVar3;
  undefined4 *puVar4;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  byte local_11;
  FunctionBody *pFStack_10;
  bool isScriptContextClosing_local;
  FunctionBody *this_local;
  
  if ((*(uint *)&this->field_0x178 >> 9 & 1) == 0) {
    local_11 = isScriptContextClosing;
    pFStack_10 = this;
    SetIsClosing(this);
    CleanupRecyclerData(this,(bool)(local_11 & 1),false);
    CleanUpForInCache(this,(bool)(local_11 & 1));
    SetObjLiteralCount(this,0);
    ParseableFunctionInfo::SetScopeSlotArraySizes(&this->super_ParseableFunctionInfo,0,0);
    local_20 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
    operator=(&(this->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs,&local_20);
    if (((((local_11 & 1) == 0) && ((*(ushort *)&this->field_0x17c >> 9 & 1) != 0)) &&
        (ppBVar3 = Memory::WriteBarrierPtr::operator_cast_to_ByteBlock__
                             ((WriteBarrierPtr *)&this->byteCodeBlock), *ppBVar3 != (ByteBlock *)0x0
        )) && (bVar2 = ParseableFunctionInfo::IsWasmFunction(&this->super_ParseableFunctionInfo),
              bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1e17,
                                  "(isScriptContextClosing || !m_hasActiveReference || !this->byteCodeBlock || !this->IsWasmFunction())"
                                  ,
                                  "We should never reset the bytecode block for Wasm when still referenced"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ByteBlock>::operator=(&this->byteCodeBlock,&local_28);
    local_30 = (nullptr_t)0x0;
    Memory::
    WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
    ::operator=(&this->entryPoints,&local_30);
    local_38 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<void_*>::operator=(&this->inlineCaches,&local_38);
    local_40 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<int>::operator=(&this->cacheIdToPropertyIdMap,&local_40);
    InlineCachePointerArray<Js::PolymorphicInlineCache>::Reset(&this->polymorphicInlineCaches);
    SetConstTable(this,(Type *)0x0);
    bVar2 = HasInterpreterThunkGenerated(this);
    if ((bVar2) && ((local_11 & 1) == 0)) {
      if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 10 & 1)
          == 0) {
        ScriptContext::ReleaseDynamicInterpreterThunk
                  ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
                   (BYTE *)(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk,true);
      }
      else {
        ScriptContext::ReleaseDynamicAsmJsInterpreterThunk
                  ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
                   (BYTE *)(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk,true);
      }
    }
    *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffdff | 0x200;
  }
  return;
}

Assistant:

void FunctionBody::Cleanup(bool isScriptContextClosing)
    {
        if (cleanedUp)
        {
            return;
        }

        DebugOnly(this->SetIsClosing());

        CleanupRecyclerData(isScriptContextClosing, false /* capture entry point cleanup stack trace */);
        CleanUpForInCache(isScriptContextClosing);

        this->SetObjLiteralCount(0);
        this->SetScopeSlotArraySizes(0, 0);

        // Manually clear these values to break any circular references
        // that might prevent the script context from being disposed
        this->auxPtrs = nullptr;
        AssertMsg(isScriptContextClosing || !m_hasActiveReference || !this->byteCodeBlock || !this->IsWasmFunction(), "We should never reset the bytecode block for Wasm when still referenced");
        this->byteCodeBlock = nullptr;
        this->entryPoints = nullptr;
        this->inlineCaches = nullptr;
        this->cacheIdToPropertyIdMap = nullptr;
        this->polymorphicInlineCaches.Reset();
        this->SetConstTable(nullptr);

#if DYNAMIC_INTERPRETER_THUNK
        if (this->HasInterpreterThunkGenerated())
        {
            JS_ETW(EtwTrace::LogMethodInterpreterThunkUnloadEvent(this));

            if (!isScriptContextClosing)
            {
                if (m_isAsmJsFunction)
                {
                    m_scriptContext->ReleaseDynamicAsmJsInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, /*addtoFreeList*/ true);
                }
                else
                {
                    m_scriptContext->ReleaseDynamicInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, /*addtoFreeList*/ true);
                }
            }
        }
#endif

        this->cleanedUp = true;
    }